

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
get_value_or<std::__cxx11::string,char_const(&)[1]>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *this,
          string_view_type *key,char (*default_value) [1])

{
  uint uVar1;
  object *poVar2;
  const_iterator cVar3;
  not_an_object *this_00;
  allocator<char> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *val;
  allocator<char> local_22;
  allocator<char> local_21;
  
  while( true ) {
    uVar1 = (byte)*(object_storage *)this & 0xf;
    if (1 < uVar1 - 8) break;
    this = *(basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> **)
            ((object_storage *)this + 8);
  }
  if (((byte)*(object_storage *)this & 0xf) != 0) {
    if (uVar1 == 0xd) {
      poVar2 = object_storage::value_abi_cxx11_((object_storage *)this);
      cVar3 = order_preserving_json_object<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::vector>
              ::find(poVar2,key);
      poVar2 = object_storage::value_abi_cxx11_((object_storage *)this);
      if (cVar3._M_current !=
          (poVar2->members_).
          super__Vector_base<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::key_value<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        as_string<std::allocator<char>>
                  (__return_storage_ptr__,
                   (basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>> *)
                   &(cVar3._M_current)->value_);
        return __return_storage_ptr__;
      }
      __a = &local_22;
      goto LAB_002b4e8e;
    }
    if (uVar1 != 4) {
      this_00 = (not_an_object *)__cxa_allocate_exception(0x58);
      not_an_object::not_an_object<char>(this_00,key->_M_str,key->_M_len);
      __cxa_throw(this_00,&not_an_object::typeinfo,not_an_object::~not_an_object);
    }
  }
  __a = &local_21;
LAB_002b4e8e:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,*default_value,__a);
  return __return_storage_ptr__;
}

Assistant:

T get_value_or(const string_view_type& key, U&& default_value) const
        {
            static_assert(std::is_copy_constructible<T>::value,
                          "get_value_or: T must be copy constructible");
            static_assert(std::is_convertible<U&&, T>::value,
                          "get_value_or: U must be convertible to T");
            switch (storage_kind())
            {
                case json_storage_kind::null:
                case json_storage_kind::empty_object:
                    return static_cast<T>(std::forward<U>(default_value));
                case json_storage_kind::object:
                {
                    auto it = cast<object_storage>().value().find(key);
                    if (it != cast<object_storage>().value().end())
                    {
                        return (*it).value().template as<T>();
                    }
                    else
                    {
                        return static_cast<T>(std::forward<U>(default_value));
                    }
                }
                case json_storage_kind::json_const_reference:
                    return cast<json_const_reference_storage>().value().template get_value_or<T,U>(key,std::forward<U>(default_value));
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().template get_value_or<T,U>(key,std::forward<U>(default_value));
                default:
                    JSONCONS_THROW(not_an_object(key.data(),key.length()));
            }
        }